

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcObject::~IfcObject(IfcObject *this,void **vtt)

{
  void **vtt_local;
  IfcObject *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0xc];
  *(void **)&this->field_0x88 = vtt[0xd];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[0xe];
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>).field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>,vtt + 10);
  IfcObjectDefinition::~IfcObjectDefinition((IfcObjectDefinition *)this,vtt + 1);
  return;
}

Assistant:

IfcObject() : Object("IfcObject") {}